

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::I_formatter<spdlog::details::scoped_padder>::format
          (I_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  buffer<char> *buf;
  uint uVar3;
  type args;
  basic_string_view<char> fmt;
  scoped_padder p;
  scoped_padder local_50;
  ulong local_28 [2];
  
  scoped_padder::scoped_padder(&local_50,2,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = tm_time->tm_hour;
  uVar3 = uVar1 - 0xc;
  if ((int)uVar1 < 0xd) {
    uVar3 = uVar1;
  }
  if (uVar3 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (byte)((ulong)uVar3 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] =
         (char)uVar3 + ((char)(uVar3 / 10) + (char)(uVar3 / 10)) * -5 | 0x30;
  }
  else {
    local_28[0] = (ulong)uVar3;
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_28;
    args.desc_ = 1;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    ::fmt::v10::detail::vformat_to<char>(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_50);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(to12h(tm_time), dest);
    }